

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSpace.cpp
# Opt level: O3

void __thiscall mnf::RealSpace::RealSpace(RealSpace *this,Index n)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  long *plVar5;
  string *this_00;
  double *pdVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  uint __len;
  Index othersize;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  string __str;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  double local_48;
  DenseStorage<double,__1,__1,_1,_0> DStack_40;
  
  Manifold::Manifold(&this->super_Manifold,n,n,n);
  (this->super_Manifold)._vptr_Manifold = (_func_int **)&PTR__RealSpace_001419d8;
  (this->typicalMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
       = (DenseStorage<double,__1,__1,_1,_0>)0x0;
  (this->trustMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage =
       (DenseStorage<double,__1,__1,_1,_0>)0x0;
  uVar8 = -n;
  if (0 < n) {
    uVar8 = n;
  }
  __len = 1;
  if (9 < uVar8) {
    uVar7 = uVar8;
    uVar4 = 4;
    do {
      __len = uVar4;
      if (uVar7 < 100) {
        __len = __len - 2;
        goto LAB_00128a31;
      }
      if (uVar7 < 1000) {
        __len = __len - 1;
        goto LAB_00128a31;
      }
      if (uVar7 < 10000) goto LAB_00128a31;
      bVar1 = 99999 < uVar7;
      uVar7 = uVar7 / 10000;
      uVar4 = __len + 4;
    } while (bVar1);
    __len = __len + 1;
  }
LAB_00128a31:
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct((ulong)local_78,(char)__len - (char)(n >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>(local_78[0] + -(n >> 0x3f),__len,uVar8);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)local_78,0,(char *)0x0,0x136398);
  pdVar6 = (double *)(plVar5 + 2);
  if ((double *)*plVar5 == pdVar6) {
    local_48 = *pdVar6;
    DStack_40.m_data = (double *)plVar5[3];
    local_58._0_8_ = &local_48;
  }
  else {
    local_48 = *pdVar6;
    local_58._0_8_ = (double *)*plVar5;
  }
  local_58._8_8_ = plVar5[1];
  *plVar5 = (long)pdVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  this_00 = Manifold::name_abi_cxx11_(&this->super_Manifold);
  std::__cxx11::string::operator=((string *)this_00,(string *)local_58);
  if ((double *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0]);
  }
  if (n < 0) {
    __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x130,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if ((this->typicalMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_rows != n) {
    free((this->typicalMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
         m_storage.m_data);
    if (n == 0) {
      pdVar6 = (double *)0x0;
    }
    else {
      pdVar6 = Eigen::internal::conditional_aligned_new_auto<double,true>(n);
    }
    (this->typicalMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
    m_storage.m_data = pdVar6;
  }
  (this->typicalMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
  .m_rows = n;
  if ((this->trustMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_rows != n) {
    free((this->trustMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
         m_storage.m_data);
    if (n == 0) {
      pdVar6 = (double *)0x0;
    }
    else {
      pdVar6 = Eigen::internal::conditional_aligned_new_auto<double,true>(n);
    }
    (this->trustMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
    .m_data = pdVar6;
  }
  (this->trustMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = n;
  if (n == 0) {
    pdVar6 = (double *)0x0;
  }
  else {
    pdVar6 = Eigen::internal::conditional_aligned_new_auto<double,true>(n);
    auVar3 = _DAT_0012f030;
    auVar2 = _DAT_0012f020;
    uVar8 = n + 0x1fffffffffffffffU & 0x1fffffffffffffff;
    auVar10._8_4_ = (int)uVar8;
    auVar10._0_8_ = uVar8;
    auVar10._12_4_ = (int)(uVar8 >> 0x20);
    lVar9 = 0;
    auVar10 = auVar10 ^ _DAT_0012f030;
    do {
      auVar11._8_4_ = (int)lVar9;
      auVar11._0_8_ = lVar9;
      auVar11._12_4_ = (int)((ulong)lVar9 >> 0x20);
      auVar11 = (auVar11 | auVar2) ^ auVar3;
      if ((bool)(~(auVar11._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar11._0_4_ ||
                  auVar10._4_4_ < auVar11._4_4_) & 1)) {
        pdVar6[lVar9] = 1.0;
      }
      if ((auVar11._12_4_ != auVar10._12_4_ || auVar11._8_4_ <= auVar10._8_4_) &&
          auVar11._12_4_ <= auVar10._12_4_) {
        pdVar6[lVar9 + 1] = 1.0;
      }
      lVar9 = lVar9 + 2;
    } while ((uVar8 - ((uint)(n + 0x1fffffffffffffffU) & 1)) + 2 != lVar9);
  }
  DStack_40.m_data = (double *)0x0;
  DStack_40.m_rows = 0;
  local_58._0_8_ = pdVar6;
  local_58._8_8_ = n;
  setTypicalMagnitude(this,(ConstRefVec *)local_58);
  DStack_40.m_data = (double *)0x0;
  DStack_40.m_rows = 0;
  local_58._0_8_ = pdVar6;
  local_58._8_8_ = n;
  setTrustMagnitude(this,(ConstRefVec *)local_58);
  free(pdVar6);
  return;
}

Assistant:

RealSpace::RealSpace(Index n) : Manifold(n, n, n)
{
  name() = "R" + std::to_string(n);
  typicalMagnitude_.resize(n);
  trustMagnitude_.resize(n);
  Eigen::VectorXd temp = Eigen::VectorXd::Constant(n, 1.0);
  setTypicalMagnitude(temp);
  setTrustMagnitude(temp);
}